

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

uint64_t __thiscall leveldb::anon_unknown_0::ShardedLRUCache::NewId(ShardedLRUCache *this)

{
  Mutex *pMVar1;
  MutexLock *in_RDI;
  MutexLock l;
  Mutex *in_stack_ffffffffffffffd8;
  
  MutexLock::MutexLock(in_RDI,in_stack_ffffffffffffffd8);
  pMVar1 = (Mutex *)((long)&((in_RDI[0x1b7].mu_)->mu_).super___mutex_base._M_mutex + 1);
  in_RDI[0x1b7].mu_ = pMVar1;
  MutexLock::~MutexLock((MutexLock *)0x13b91a);
  return (uint64_t)pMVar1;
}

Assistant:

uint64_t NewId() override {
    MutexLock l(&id_mutex_);
    return ++(last_id_);
  }